

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackArchiveGenerator.cxx
# Opt level: O2

int __thiscall cmCPackArchiveGenerator::InitializeInternal(cmCPackArchiveGenerator *this)

{
  cmCPackLog *this_00;
  bool bVar1;
  int iVar2;
  cmValue cVar3;
  ostream *poVar4;
  string_view str;
  string newExtension;
  string local_1b0;
  undefined7 uStack_1af;
  ostringstream cmCPackLog_msg;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCPackLog_msg,"CPACK_INCLUDE_TOPLEVEL_DIRECTORY",
             (allocator<char> *)&newExtension);
  cmCPackGenerator::SetOptionIfNotSet(&this->super_cmCPackGenerator,(string *)&cmCPackLog_msg,"1");
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCPackLog_msg,"CPACK_ARCHIVE_FILE_EXTENSION",
             (allocator<char> *)&newExtension);
  cVar3 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&cmCPackLog_msg);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  if ((cVar3.Value != (string *)0x0) && ((cVar3.Value)->_M_string_length != 0)) {
    std::__cxx11::string::string((string *)&newExtension,(string *)cVar3.Value);
    str._M_str = newExtension._M_dataplus._M_p;
    str._M_len = newExtension._M_string_length;
    bVar1 = cmHasLiteralPrefix<2ul>(str,(char (*) [2])0x6c29f1);
    if (!bVar1) {
      local_1b0 = (string)0x2e;
      cmStrCat<char,std::__cxx11::string&>
                ((string *)&cmCPackLog_msg,(char *)&local_1b0,&newExtension);
      std::__cxx11::string::operator=((string *)&newExtension,(string *)&cmCPackLog_msg);
      std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
    poVar4 = std::operator<<((ostream *)&cmCPackLog_msg,"Using user-provided file extension ");
    poVar4 = std::operator<<(poVar4,(string *)&newExtension);
    poVar4 = std::operator<<(poVar4," instead of the default ");
    poVar4 = std::operator<<(poVar4,(string *)&this->OutputExtension);
    std::endl<char,std::char_traits<char>>(poVar4);
    this_00 = (this->super_cmCPackGenerator).Logger;
    std::__cxx11::stringbuf::str();
    cmCPackLog::Log(this_00,4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                    ,0xdf,(char *)CONCAT71(uStack_1af,local_1b0));
    std::__cxx11::string::~string(&local_1b0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
    std::__cxx11::string::operator=((string *)&this->OutputExtension,(string *)&newExtension);
    std::__cxx11::string::~string((string *)&newExtension);
  }
  iVar2 = cmCPackGenerator::InitializeInternal(&this->super_cmCPackGenerator);
  return iVar2;
}

Assistant:

int cmCPackArchiveGenerator::InitializeInternal()
{
  this->SetOptionIfNotSet("CPACK_INCLUDE_TOPLEVEL_DIRECTORY", "1");
  cmValue newExtensionValue = this->GetOption("CPACK_ARCHIVE_FILE_EXTENSION");
  if (!newExtensionValue.IsEmpty()) {
    std::string newExtension = *newExtensionValue;
    if (!cmHasLiteralPrefix(newExtension, ".")) {
      newExtension = cmStrCat('.', newExtension);
    }
    cmCPackLogger(cmCPackLog::LOG_DEBUG,
                  "Using user-provided file extension "
                    << newExtension << " instead of the default "
                    << this->OutputExtension << std::endl);
    this->OutputExtension = std::move(newExtension);
  }
  return this->Superclass::InitializeInternal();
}